

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode Curl_creader_set(Curl_easy *data,Curl_creader *r)

{
  CURLcode CVar1;
  CURLcode result;
  Curl_creader *r_local;
  Curl_easy *data_local;
  
  cl_reset_reader(data);
  CVar1 = do_init_reader_stack(data,r);
  if (CVar1 != CURLE_OK) {
    Curl_creader_free(data,r);
  }
  return CVar1;
}

Assistant:

CURLcode Curl_creader_set(struct Curl_easy *data, struct Curl_creader *r)
{
  CURLcode result;

  DEBUGASSERT(r);
  DEBUGASSERT(r->crt);
  DEBUGASSERT(r->phase == CURL_CR_CLIENT);

  cl_reset_reader(data);
  result = do_init_reader_stack(data, r);
  if(result)
    Curl_creader_free(data, r);
  return result;
}